

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O1

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPointPair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  int iVar1;
  ActualDstType actualDst;
  Matrix<double,_3,_1,_0,_3,_1> P;
  Matrix<double,_4,_1,_0,_4,_1> Q;
  Matrix<double,_4,_4,_0,_4,_4> *local_68;
  double *local_60;
  double local_58;
  double dStack_50;
  double local_48;
  Matrix<double,_4,_1,_0,_4,_1> local_38;
  
  iVar1 = rand();
  local_58 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * 40.0;
  iVar1 = rand();
  dStack_50 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * 40.0;
  iVar1 = rand();
  local_48 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * 40.0;
  local_68 = T;
  local_60 = &local_58;
  Eigen::internal::
  homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::Matrix<double,4,4,0,4,4>>
  ::evalTo<Eigen::Matrix<double,4,1,0,4,1>>
            ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::Matrix<double,4,4,0,4,4>>
              *)&local_68,&local_38);
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = local_58;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = dStack_50;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = local_48;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = 1.0;
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [3];
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}